

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  undefined8 this_00;
  bool bVar1;
  XmlWriter *pXVar2;
  string local_258;
  StringRef local_238;
  allocator<char> local_221;
  string local_220;
  StringRef local_200;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  ScopedElement sourceTag;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_170;
  allocator<char> local_159;
  string local_158;
  char *local_138;
  size_type sStack_130;
  allocator<char> local_119;
  string local_118;
  StringRef local_f8;
  allocator<char> local_e1;
  string local_e0;
  TestCaseInfo *local_c0;
  TestCaseInfo *testInfo;
  string local_b0 [32];
  undefined1 local_90 [8];
  ScopedElement innerTag;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement outerTag;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests_local;
  XmlReporter *this_local;
  
  outerTag._8_8_ = tests;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"MatchingTests",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = outerTag._8_8_;
  __end1 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                     ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                      outerTag._8_8_);
  test = (TestCaseHandle *)
         std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                   ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)this_00
                   );
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                *)&test);
    if (!bVar1) break;
    innerTag._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
         ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_b0,"TestCase",(allocator<char> *)((long)&testInfo + 7));
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,(XmlFormatting)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testInfo + 7));
    local_c0 = TestCaseHandle::getTestCaseInfo((TestCaseHandle *)innerTag._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Name",&local_e1);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_e0,Indent);
    StringRef::StringRef(&local_f8,&local_c0->name);
    pXVar2 = XmlWriter::writeText(pXVar2,local_f8,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"ClassName",&local_119);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_118,Indent);
    local_138 = (local_c0->className).m_start;
    sStack_130 = (local_c0->className).m_size;
    pXVar2 = XmlWriter::writeText(pXVar2,local_c0->className,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Tags",&local_159);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_158,Indent);
    TestCaseInfo::tagsAsString_abi_cxx11_((string *)&sourceTag.m_fmt,local_c0);
    StringRef::StringRef((StringRef *)&local_170,(string *)&sourceTag.m_fmt);
    pXVar2 = XmlWriter::writeText(pXVar2,(StringRef)local_170,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&sourceTag.m_fmt);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"SourceInfo",&local_1c1);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_1a0,(string *)&this->m_xml,(XmlFormatting)local_1c0)
    ;
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"File",&local_1e9);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_1e8,Indent);
    StringRef::StringRef(&local_200,(local_c0->lineInfo).file);
    pXVar2 = XmlWriter::writeText(pXVar2,local_200,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Line",&local_221);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_220,Indent);
    std::__cxx11::to_string(&local_258,(local_c0->lineInfo).line);
    StringRef::StringRef(&local_238,&local_258);
    pXVar2 = XmlWriter::writeText(pXVar2,local_238,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1a0);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&__end1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const& tests) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const& test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const& testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                 .writeText(testInfo.name, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                 .writeText(testInfo.className, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                 .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                 .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                 .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
        }
    }